

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-macros.h
# Opt level: O0

uint64_t estimateDiv128To64(uint64_t a0,uint64_t a1,uint64_t b)

{
  ulong local_70;
  uint64_t local_68;
  uint64_t local_60;
  uint64_t z;
  uint64_t term1;
  uint64_t term0;
  uint64_t rem1;
  uint64_t rem0;
  uint64_t b1;
  uint64_t b0;
  uint64_t b_local;
  uint64_t a1_local;
  uint64_t a0_local;
  
  if (a0 < b) {
    b1 = b >> 0x20;
    if (a0 < b1 << 0x20) {
      local_68 = a0 / b1 << 0x20;
    }
    else {
      local_68 = 0xffffffff00000000;
    }
    local_60 = local_68;
    b0 = b;
    b_local = a1;
    a1_local = a0;
    mul64To128(b,local_68,&term1,&z);
    sub128(a1_local,b_local,term1,z,&rem1,&term0);
    while ((long)rem1 < 0) {
      local_60 = local_60 - 0x100000000;
      rem0 = b0 << 0x20;
      add128(rem1,term0,b1,rem0,&rem1,&term0);
    }
    local_70 = rem1 << 0x20 | term0 >> 0x20;
    if (local_70 < b1 << 0x20) {
      local_70 = local_70 / b1;
    }
    else {
      local_70 = 0xffffffff;
    }
    a0_local = local_70 | local_60;
  }
  else {
    a0_local = 0xffffffffffffffff;
  }
  return a0_local;
}

Assistant:

static inline uint64_t estimateDiv128To64(uint64_t a0, uint64_t a1, uint64_t b)
{
    uint64_t b0, b1;
    uint64_t rem0, rem1, term0, term1;
    uint64_t z;

    if ( b <= a0 ) return UINT64_C(0xFFFFFFFFFFFFFFFF);
    b0 = b>>32;
    z = ( b0<<32 <= a0 ) ? UINT64_C(0xFFFFFFFF00000000) : ( a0 / b0 )<<32;
    mul64To128( b, z, &term0, &term1 );
    sub128( a0, a1, term0, term1, &rem0, &rem1 );
    while ( ( (int64_t) rem0 ) < 0 ) {
        z -= UINT64_C(0x100000000);
        b1 = b<<32;
        add128( rem0, rem1, b0, b1, &rem0, &rem1 );
    }
    rem0 = ( rem0<<32 ) | ( rem1>>32 );
    z |= ( b0<<32 <= rem0 ) ? 0xFFFFFFFF : rem0 / b0;
    return z;

}